

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definition.cpp
# Opt level: O0

string * __thiscall
huelang::DefinitionTable::GetName_abi_cxx11_
          (string *__return_storage_ptr__,DefinitionTable *this,Word word)

{
  reference pvVar1;
  DefinitionTable *this_local;
  Word word_local;
  
  pvVar1 = std::
           vector<huelang::DefinitionTableEntry,_std::allocator<huelang::DefinitionTableEntry>_>::
           operator[](this->buckets + word.major,word.minor);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar1);
  return __return_storage_ptr__;
}

Assistant:

string DefinitionTable::GetName(Word word) {
        return buckets[word.major][word.minor].name;
    }